

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_3,_2> *
tcu::operator*(Matrix<float,_3,_2> *__return_storage_ptr__,Matrix<float,_3,_3> *a,
              Matrix<float,_3,_2> *b)

{
  bool bVar1;
  int row;
  long lVar2;
  int ndx;
  long lVar3;
  Matrix<float,_3,_2> *res;
  bool bVar4;
  long lVar5;
  Vector<float,_3> *pVVar6;
  float v;
  float fVar7;
  
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[0].m_data + 2) = 0;
  pVVar6 = (__return_storage_ptr__->m_data).m_data;
  pVVar6[1].m_data[1] = 0.0;
  pVVar6[1].m_data[2] = 0.0;
  lVar2 = 0;
  do {
    fVar7 = 1.0;
    if (lVar2 != 0) {
      fVar7 = 0.0;
    }
    (__return_storage_ptr__->m_data).m_data[0].m_data[lVar2] = fVar7;
    fVar7 = 1.0;
    if (lVar2 != 1) {
      fVar7 = 0.0;
    }
    (__return_storage_ptr__->m_data).m_data[1].m_data[lVar2] = fVar7;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    lVar5 = 0;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      fVar7 = 0.0;
      lVar3 = 0;
      pVVar6 = (Vector<float,_3> *)a;
      do {
        fVar7 = fVar7 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar6->m_data)->m_data[0].m_data[0] *
                        (b->m_data).m_data[lVar5].m_data[lVar3];
        lVar3 = lVar3 + 1;
        pVVar6 = pVVar6 + 1;
      } while (lVar3 != 3);
      (__return_storage_ptr__->m_data).m_data[lVar5].m_data[lVar2] = fVar7;
      lVar5 = 1;
      bVar1 = false;
    } while (bVar4);
    lVar2 = lVar2 + 1;
    a = (Matrix<float,_3,_3> *)(((Vector<float,_3> *)a)->m_data + 1);
  } while (lVar2 != 3);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}